

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

void __thiscall cmCTestCurl::SetProxyType(cmCTestCurl *this)

{
  string *psVar1;
  bool bVar2;
  curl_proxytype cVar3;
  string type;
  string passwd;
  string port;
  
  (this->HTTPProxy)._M_string_length = 0;
  *(this->HTTPProxy)._M_dataplus._M_p = '\0';
  this->HTTPProxyType = CURLPROXY_HTTP;
  (this->HTTPProxyAuth)._M_string_length = 0;
  psVar1 = &this->HTTPProxy;
  *(this->HTTPProxyAuth)._M_dataplus._M_p = '\0';
  bVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY",psVar1);
  if (!bVar2) {
    return;
  }
  port._M_dataplus._M_p = (pointer)&port.field_2;
  port._M_string_length = 0;
  port.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT",&port);
  if (bVar2) {
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((string *)psVar1);
  }
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_TYPE",&type);
  psVar1 = &this->HTTPProxyAuth;
  if (bVar2) {
    bVar2 = std::operator==(&type,"HTTP");
    cVar3 = CURLPROXY_HTTP;
    if (!bVar2) {
      bVar2 = std::operator==(&type,"SOCKS4");
      if (bVar2) {
        cVar3 = CURLPROXY_SOCKS4;
      }
      else {
        bVar2 = std::operator==(&type,"SOCKS5");
        if (!bVar2) goto LAB_001defbe;
        cVar3 = CURLPROXY_SOCKS5;
      }
    }
    this->HTTPProxyType = cVar3;
  }
LAB_001defbe:
  cmsys::SystemTools::GetEnv("HTTP_PROXY_USER",psVar1);
  passwd._M_dataplus._M_p = (pointer)&passwd.field_2;
  passwd._M_string_length = 0;
  passwd.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD",&passwd);
  if (bVar2) {
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((string *)psVar1);
  }
  std::__cxx11::string::~string((string *)&passwd);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&port);
  return;
}

Assistant:

void cmCTestCurl::SetProxyType()
{
  this->HTTPProxy.clear();
  // this is the default
  this->HTTPProxyType = CURLPROXY_HTTP;
  this->HTTPProxyAuth.clear();
  if (cmSystemTools::GetEnv("HTTP_PROXY", this->HTTPProxy)) {
    std::string port;
    if (cmSystemTools::GetEnv("HTTP_PROXY_PORT", port)) {
      this->HTTPProxy += ":";
      this->HTTPProxy += port;
    }
    std::string type;
    if (cmSystemTools::GetEnv("HTTP_PROXY_TYPE", type)) {
      // HTTP/SOCKS4/SOCKS5
      if (type == "HTTP") {
        this->HTTPProxyType = CURLPROXY_HTTP;
      } else if (type == "SOCKS4") {
        this->HTTPProxyType = CURLPROXY_SOCKS4;
      } else if (type == "SOCKS5") {
        this->HTTPProxyType = CURLPROXY_SOCKS5;
      }
    }
    cmSystemTools::GetEnv("HTTP_PROXY_USER", this->HTTPProxyAuth);
    std::string passwd;
    if (cmSystemTools::GetEnv("HTTP_PROXY_PASSWD", passwd)) {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += passwd;
    }
  }
}